

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O3

char * strlwc(char *in,char *out,uint len)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (len == 0 || (out == (char *)0x0 || in == (char *)0x0)) {
    out = (char *)0x0;
  }
  else {
    cVar1 = *in;
    if (len - 1 == 0 || cVar1 == '\0') {
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      do {
        iVar2 = tolower((int)cVar1);
        out[uVar4] = (char)iVar2;
        uVar3 = uVar4 + 1;
        if (len - 1 <= uVar3) break;
        cVar1 = in[uVar4 + 1];
        uVar4 = uVar3;
      } while (cVar1 != '\0');
    }
    out[uVar3] = '\0';
  }
  return out;
}

Assistant:

static const char * strlwc(const char * in, char *out, unsigned len)
{
    unsigned i ;

    if (in == NULL || out == NULL || len == 0) return NULL ;
    i = 0 ;
    while (in[i] != '\0' && i < len - 1) {
        out[i] = (char)tolower((int)in[i]);
        i++ ;
    }
    out[i] = '\0';
    return out ;
}